

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryRatesWithIndex
          (BeagleCPUImpl<float,_1,_0> *this,int categoryRatesIndex,double *inCategoryRates)

{
  void *pvVar1;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0x30) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0x70) + (long)in_ESI * 8) == 0) {
      pvVar1 = malloc((long)*(int *)(in_RDI + 0x34) << 3);
      *(void **)(*(long *)(in_RDI + 0x70) + (long)in_ESI * 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0x70) + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    memcpy(*(void **)(*(long *)(in_RDI + 0x70) + (long)in_ESI * 8),in_RDX,
           (long)*(int *)(in_RDI + 0x34) << 3);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryRatesWithIndex(int categoryRatesIndex,
                                                                 const double* inCategoryRates) {
    if (categoryRatesIndex < 0 || categoryRatesIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryRates[categoryRatesIndex] == NULL) {
        gCategoryRates[categoryRatesIndex] = (double*) malloc(sizeof(double) * kCategoryCount);
        if (gCategoryRates[categoryRatesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    memcpy(gCategoryRates[categoryRatesIndex], inCategoryRates, sizeof(double) * kCategoryCount);
    return BEAGLE_SUCCESS;
}